

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  vector<Reading,_std::allocator<Reading>_> readings;
  allocator<char> local_59;
  double local_58;
  double local_50;
  _Vector_base<Reading,_std::allocator<Reading>_> local_48;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"raw_temps.txt",&local_59);
  get_readings_from_file((vector<Reading,_std::allocator<Reading>_> *)&local_48,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  local_58 = get_mean_temp((vector<Reading,_std::allocator<Reading>_> *)&local_48);
  local_50 = get_median_temp((vector<Reading,_std::allocator<Reading>_> *)&local_48);
  std::operator<<((ostream *)&std::cout,"Median temperature: ");
  poVar1 = std::ostream::_M_insert<double>(local_50);
  std::operator<<(poVar1,", mean temperature: ");
  poVar1 = std::ostream::_M_insert<double>(local_58);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<Reading,_std::allocator<Reading>_>::~_Vector_base(&local_48);
  return 0;
}

Assistant:

int main()
{
	const char* file_name{ "raw_temps.txt" };
	try
	{
		auto readings = get_readings_from_file(file_name);
		auto mean = get_mean_temp(readings);
		auto median = get_median_temp(readings);
		std::cout << "Median temperature: " << median
			<< ", mean temperature: " << mean << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}